

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tester.h
# Opt level: O3

void __thiscall MemMat<int>::MemMat(MemMat<int> *this,Mat_<int> *img)

{
  undefined4 uVar1;
  Mat aMStack_f8 [96];
  ulong local_98 [13];
  
  cv::Mat::Mat(&(this->img_).super_Mat);
  *(uint *)&this->img_ = *(uint *)&this->img_ & 0xfffff000 | 4;
  cv::Mat::Mat(&(this->accesses_).super_Mat);
  *(uint *)&this->accesses_ = *(uint *)&this->accesses_ & 0xfffff000 | 4;
  cv::Mat::clone();
  cv::Mat::Mat((Mat *)local_98);
  local_98[0] = local_98[0] & 0xfffffffffffff000 | 4;
  cv::Mat_<int>::operator=((Mat_<int> *)local_98,aMStack_f8);
  cv::Mat::~Mat(aMStack_f8);
  cv::Mat::operator=(&(this->img_).super_Mat,(Mat *)local_98);
  cv::Mat::~Mat((Mat *)local_98);
  cv::Mat::Mat(aMStack_f8,**(int **)&img->field_0x40,(*(int **)&img->field_0x40)[1],4);
  local_98[2] = 0;
  local_98[3] = 0;
  local_98[0] = 0;
  local_98[1] = 0;
  cv::Mat::operator=(aMStack_f8,(Scalar_ *)local_98);
  cv::Mat::operator=(&(this->accesses_).super_Mat,aMStack_f8);
  cv::Mat::~Mat(aMStack_f8);
  uVar1 = *(undefined4 *)&img->field_0xc;
  this->rows = *(undefined4 *)&img->field_0x8;
  this->cols = uVar1;
  return;
}

Assistant:

MemMat(cv::Mat_<T> img)
    {
        img_ = img.clone(); // Deep copy
        accesses_ = cv::Mat1i(img.size(), 0);
        rows = img.rows;
        cols = img.cols;
    }